

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O3

void cfd::api::CollectUtxoDataByFundRawTransaction
               (ConfidentialTransactionContext *ctx,
               vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
               *selected_txin_utxos,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *txin_amount_map,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *tx_amount_map,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *asset_list,int32_t *fee_index)

{
  Txid *pTVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  char cVar5;
  byte bVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  iterator iVar8;
  mapped_type *pmVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  __normal_iterator<cfd::core::OutPoint_*,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>
  _Var12;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  long lVar13;
  _func_int **pp_Var14;
  long lVar15;
  ulong uVar16;
  pointer *__x;
  initializer_list<cfd::core::OutPoint> __l;
  string asset;
  string asset_1;
  vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> outpoint_list;
  string asset_2;
  string token;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
  asset_utxo_map;
  BlindFactor asset_entropy;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  txin_list;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txout_list;
  pointer local_1c8;
  undefined **local_1b0;
  OutPoint local_1a0;
  _Base_ptr local_178;
  pointer local_170;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
  *local_168;
  ConfidentialValue local_160;
  ConfidentialValue local_138;
  long local_110;
  undefined1 local_108;
  key_type local_100;
  key_type local_e0;
  undefined1 local_c0 [16];
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  pointer local_98;
  BlindFactor local_88;
  long local_68;
  long local_60;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *local_50;
  long local_48;
  long local_40;
  
  local_168 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
               *)tx_amount_map;
  local_50 = selected_txin_utxos;
  cfd::core::ConfidentialTransaction::GetTxOutList();
  if (local_40 != local_48) {
    local_170 = (pointer)(local_168 + 8);
    lVar15 = 0x78;
    uVar16 = 0;
    local_178 = (_Base_ptr)&PTR__ConfidentialValue_002b0e40;
    do {
      lVar13 = local_48;
      cfd::core::Script::Script((Script *)local_c0,(Script *)(local_48 + lVar15 + -0x60));
      cVar5 = cfd::core::Script::IsEmpty();
      core::Script::~Script((Script *)local_c0);
      if (cVar5 == '\0') {
        cfd::core::ConfidentialAssetId::ConfidentialAssetId
                  ((ConfidentialAssetId *)local_c0,(ConfidentialAssetId *)(lVar13 + lVar15 + -0x28))
        ;
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        local_c0._0_8_ = &PTR__ConfidentialAssetId_002b0ea0;
        if ((void *)CONCAT44(local_c0._12_4_,local_c0._8_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_c0._12_4_,local_c0._8_4_));
        }
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ((asset_list->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                           (asset_list->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish,&local_1a0);
        if (_Var7._M_current ==
            (asset_list->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(asset_list,(value_type *)&local_1a0);
        }
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)local_168,(key_type *)&local_1a0);
        if ((pointer)iVar10._M_node == local_170) {
          local_c0._0_8_ = (_func_int **)0x0;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
          ::_M_emplace_unique<std::__cxx11::string&,long&>
                    (local_168,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0
                     ,(long *)local_c0);
        }
        cfd::core::ConfidentialValue::ConfidentialValue
                  ((ConfidentialValue *)local_c0,(ConfidentialValue *)(lVar13 + lVar15));
        local_160._vptr_ConfidentialValue = (_func_int **)cfd::core::ConfidentialValue::GetAmount();
        local_160.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._0_1_ = extraout_DL;
        lVar13 = cfd::core::Amount::GetSatoshiValue();
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                *)local_168,(key_type *)&local_1a0);
        *pmVar11 = *pmVar11 + lVar13;
        local_c0._0_8_ = local_178;
        if ((void *)CONCAT44(local_c0._12_4_,local_c0._8_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_c0._12_4_,local_c0._8_4_));
        }
        if (local_1a0.txid_._vptr_Txid !=
            (_func_int **)
            ((long)&local_1a0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8U))
        {
          operator_delete(local_1a0.txid_._vptr_Txid);
        }
      }
      else {
        *fee_index = (int32_t)uVar16;
      }
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0xf8;
    } while (uVar16 < (ulong)((local_40 - local_48 >> 3) * -0x1084210842108421));
  }
  local_a8 = (_Base_ptr)(local_c0 + 8);
  local_c0._8_4_ = _S_red;
  local_b0 = (_Base_ptr)0x0;
  local_98 = (pointer)0x0;
  local_a0 = local_a8;
  cfd::core::ConfidentialTransaction::GetTxInList();
  local_1c8 = (local_50->
              super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_170 = (local_50->
              super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (local_1c8 != local_170) {
    local_178 = &(txin_amount_map->_M_t)._M_impl.super__Rb_tree_header._M_header;
    do {
      lVar15 = local_60;
      if (local_68 != local_60) {
        pTVar1 = &(local_1c8->utxo).txid;
        lVar13 = local_68;
        do {
          cfd::core::Txid::Txid(&local_1a0.txid_,(Txid *)(lVar13 + 8));
          cVar5 = cfd::core::Txid::Equals(&local_1a0.txid_);
          if (cVar5 == '\0') {
            local_1a0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b0f00;
            if ((_func_int **)
                local_1a0.txid_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (_func_int **)0x0) {
              operator_delete(local_1a0.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            uVar2 = (local_1c8->utxo).vout;
            uVar3 = *(uint32_t *)(lVar13 + 0x28);
            local_1a0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b0f00;
            if ((_func_int **)
                local_1a0.txid_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (_func_int **)0x0) {
              operator_delete(local_1a0.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (uVar2 == uVar3) {
              cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
              _Var7 = std::
                      __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                ((asset_list->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start,
                                 (asset_list->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish,&local_160);
              if (_Var7._M_current ==
                  (asset_list->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(asset_list,(value_type *)&local_160);
              }
              iVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                              *)local_c0,(key_type *)&local_160);
              if (iVar8._M_node == (_Base_ptr)(local_c0 + 8)) {
                cfd::core::OutPoint::OutPoint(&local_1a0,pTVar1,(local_1c8->utxo).vout);
                __l._M_len = 1;
                __l._M_array = &local_1a0;
                std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::vector
                          ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)
                           &local_138,__l,(allocator_type *)&local_88);
                local_1a0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b0f00;
                if ((_func_int **)
                    local_1a0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (_func_int **)0x0) {
                  operator_delete(local_1a0.txid_.data_.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                                       *)local_c0,(key_type *)&local_160);
                std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::operator=
                          (pmVar9,(vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>
                                   *)&local_138);
                std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::~vector
                          ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)
                           &local_138);
              }
              else {
                cfd::core::OutPoint::OutPoint(&local_1a0,pTVar1,(local_1c8->utxo).vout);
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                                       *)local_c0,(key_type *)&local_160);
                std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::push_back
                          (pmVar9,&local_1a0);
                local_1a0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b0f00;
                if ((_func_int **)
                    local_1a0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (_func_int **)0x0) {
                  operator_delete(local_1a0.txid_.data_.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
              }
              iVar10 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                       ::find(&txin_amount_map->_M_t,(key_type *)&local_160);
              if (iVar10._M_node == local_178) {
                local_1a0.txid_._vptr_Txid = (_func_int **)0x0;
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                ::_M_emplace_unique<std::__cxx11::string&,long&>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                            *)txin_amount_map,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_160,(long *)&local_1a0);
              }
              lVar15 = cfd::core::Amount::GetSatoshiValue();
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                        ::operator[](txin_amount_map,(key_type *)&local_160);
              *pmVar11 = *pmVar11 + lVar15;
              if (local_160._vptr_ConfidentialValue !=
                  (_func_int **)
                  ((long)&local_160.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 8U)) {
                operator_delete(local_160._vptr_ConfidentialValue);
              }
              break;
            }
          }
          lVar13 = lVar13 + 0x160;
        } while (lVar13 != lVar15);
      }
      local_1c8 = local_1c8 + 1;
    } while (local_1c8 != local_170);
  }
  if (local_68 != local_60) {
    local_178 = (_Base_ptr)(local_168 + 8);
    local_170 = (pointer)&(txin_amount_map->_M_t)._M_impl.super__Rb_tree_header;
    local_1b0 = &PTR__ConfidentialValue_002b0e40;
    __x = (pointer *)(local_68 + 0x90);
    do {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a0,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
      cVar5 = cfd::core::ByteData256::IsEmpty();
      bVar6 = 1;
      if (cVar5 != '\0') {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_160,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(__x + 3));
        bVar6 = cfd::core::ByteData256::IsEmpty();
        if (local_160._vptr_ConfidentialValue != (_func_int **)0x0) {
          operator_delete(local_160._vptr_ConfidentialValue);
        }
        bVar6 = bVar6 ^ 1;
      }
      if (local_1a0.txid_._vptr_Txid != (_func_int **)0x0) {
        operator_delete(local_1a0.txid_._vptr_Txid);
      }
      if (bVar6 != 0) {
        cfd::core::BlindFactor::BlindFactor(&local_88);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        local_e0._M_string_length = 0;
        local_e0.field_2._M_local_buf[0] = '\0';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a0,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
        cVar5 = cfd::core::ByteData256::IsEmpty();
        if (local_1a0.txid_._vptr_Txid != (_func_int **)0x0) {
          operator_delete(local_1a0.txid_._vptr_Txid);
        }
        if (cVar5 == '\0') {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_160,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(__x + 3));
          cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_1a0,(ByteData256 *)&local_160);
          cfd::core::BlindFactor::operator=(&local_88,(BlindFactor *)&local_1a0);
          local_1a0.txid_._vptr_Txid = (_func_int **)&PTR__BlindFactor_002b0e70;
          pp_Var14 = local_160._vptr_ConfidentialValue;
          if ((_func_int **)
              local_1a0.txid_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (_func_int **)0x0) {
            operator_delete(local_1a0.txid_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
            pp_Var14 = local_160._vptr_ConfidentialValue;
          }
        }
        else {
          cfd::core::Txid::Txid((Txid *)&local_160,(Txid *)(__x + -0x11));
          uVar4 = *(uint *)(__x + -0xd);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(__x + 3));
          cfd::core::ConfidentialTransaction::CalculateAssetEntropy
                    (&local_1a0.txid_,(uint)&local_160,(ByteData256 *)(ulong)uVar4);
          cfd::core::BlindFactor::operator=(&local_88,(BlindFactor *)&local_1a0);
          local_1a0.txid_._vptr_Txid = (_func_int **)&PTR__BlindFactor_002b0e70;
          if ((_func_int **)
              local_1a0.txid_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (_func_int **)0x0) {
            operator_delete(local_1a0.txid_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_138._vptr_ConfidentialValue != (_func_int **)0x0) {
            operator_delete(local_138._vptr_ConfidentialValue);
          }
          local_160._vptr_ConfidentialValue = (_func_int **)&PTR__Txid_002b0f00;
          if ((void *)CONCAT71(local_160.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_160.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
            operator_delete((void *)CONCAT71(local_160.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                             local_160.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_1_));
          }
          cfd::core::ConfidentialTransaction::CalculateReissuanceToken
                    ((BlindFactor *)&local_1a0,SUB81(&local_88,0));
          cfd::core::ConfidentialTransaction::CalculateReissuanceToken
                    ((BlindFactor *)&local_160,SUB81(&local_88,0));
          cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
          cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                           *)local_168,(key_type *)&local_138);
          if ((iVar10._M_node != local_178) ||
             (iVar10 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                               *)local_168,&local_100), iVar10._M_node != local_178)) {
            std::__cxx11::string::_M_assign((string *)&local_e0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p);
          }
          if (local_138._vptr_ConfidentialValue !=
              (_func_int **)
              ((long)&local_138.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data + 8U)) {
            operator_delete(local_138._vptr_ConfidentialValue);
          }
          local_160._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialAssetId_002b0ea0;
          if ((void *)CONCAT71(local_160.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_160.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
            operator_delete((void *)CONCAT71(local_160.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                             local_160.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_1_));
          }
          local_1a0.txid_._vptr_Txid = (_func_int **)&PTR__ConfidentialAssetId_002b0ea0;
          pp_Var14 = (_func_int **)
                     local_1a0.txid_.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
        }
        if (pp_Var14 != (_func_int **)0x0) {
          operator_delete(pp_Var14);
        }
        cfd::core::ConfidentialTransaction::CalculateAsset((BlindFactor *)&local_1a0);
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_160,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
        cVar5 = cfd::core::ByteData256::IsEmpty();
        if (local_160._vptr_ConfidentialValue != (_func_int **)0x0) {
          operator_delete(local_160._vptr_ConfidentialValue);
        }
        if (cVar5 == '\0') {
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::find(&txin_amount_map->_M_t,&local_100);
          if ((pointer)iVar10._M_node == local_170) {
            cfd::core::ConfidentialValue::ConfidentialValue
                      (&local_160,(ConfidentialValue *)(__x + 6));
            local_138._vptr_ConfidentialValue =
                 (_func_int **)cfd::core::ConfidentialValue::GetAmount();
            local_138.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start._0_1_ = extraout_DL_03;
            local_110 = cfd::core::Amount::GetSatoshiValue();
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
            ::_M_emplace_unique<std::__cxx11::string&,long>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                        *)txin_amount_map,&local_100,&local_110);
            local_160._vptr_ConfidentialValue = (_func_int **)local_1b0;
          }
          else {
            cfd::core::Txid::Txid((Txid *)&local_138,(Txid *)(__x + -0x11));
            cfd::core::OutPoint::OutPoint
                      ((OutPoint *)&local_160,(Txid *)&local_138,*(uint *)(__x + -0xd));
            local_138._vptr_ConfidentialValue = (_func_int **)&PTR__Txid_002b0f00;
            if ((void *)CONCAT71(local_138.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_138.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
              operator_delete((void *)CONCAT71(local_138.data_.data_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                               local_138.data_.data_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_1_));
            }
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                                   *)local_c0,&local_100);
            _Var12 = std::
                     __find_if<__gnu_cxx::__normal_iterator<cfd::core::OutPoint*,std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>>,__gnu_cxx::__ops::_Iter_equals_val<cfd::core::OutPoint_const>>
                               ((pmVar9->
                                super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>
                                )._M_impl.super__Vector_impl_data._M_start,
                                (pmVar9->
                                super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>
                                )._M_impl.super__Vector_impl_data._M_finish,&local_160);
            if (_Var12._M_current ==
                (pmVar9->
                super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
              cfd::core::ConfidentialValue::ConfidentialValue
                        (&local_138,(ConfidentialValue *)(__x + 6));
              local_110 = cfd::core::ConfidentialValue::GetAmount();
              local_108 = extraout_DL_02;
              lVar15 = cfd::core::Amount::GetSatoshiValue();
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                        ::operator[](txin_amount_map,&local_100);
              *pmVar11 = *pmVar11 + lVar15;
              local_138._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_002b0e40;
              if ((void *)CONCAT71(local_138.data_.data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_138.data_.data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0)
              {
                operator_delete((void *)CONCAT71(local_138.data_.data_.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                 local_138.data_.data_.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_1_));
              }
            }
            local_160._vptr_ConfidentialValue = (_func_int **)&PTR__Txid_002b0f00;
          }
LAB_00206e3b:
          if ((void *)CONCAT71(local_160.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_160.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
            operator_delete((void *)CONCAT71(local_160.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                             local_160.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_1_));
          }
        }
        else {
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::find(&txin_amount_map->_M_t,&local_100);
          if ((pointer)iVar10._M_node == local_170) {
            cfd::core::ConfidentialValue::ConfidentialValue
                      (&local_160,(ConfidentialValue *)(__x + 6));
            local_138._vptr_ConfidentialValue =
                 (_func_int **)cfd::core::ConfidentialValue::GetAmount();
            local_138.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start._0_1_ = extraout_DL_00;
            local_110 = cfd::core::Amount::GetSatoshiValue();
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
            ::_M_emplace_unique<std::__cxx11::string&,long>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                        *)txin_amount_map,&local_100,&local_110);
            local_160._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_002b0e40;
            if ((void *)CONCAT71(local_160.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_160.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
              operator_delete((void *)CONCAT71(local_160.data_.data_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                               local_160.data_.data_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_1_));
            }
          }
          if ((local_e0._M_string_length != 0) &&
             (iVar10 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                       ::find(&txin_amount_map->_M_t,&local_e0),
             (pointer)iVar10._M_node == local_170)) {
            cfd::core::ConfidentialValue::ConfidentialValue
                      (&local_160,(ConfidentialValue *)(__x + 0xb));
            local_138._vptr_ConfidentialValue =
                 (_func_int **)cfd::core::ConfidentialValue::GetAmount();
            local_138.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start._0_1_ = extraout_DL_01;
            local_110 = cfd::core::Amount::GetSatoshiValue();
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
            ::_M_emplace_unique<std::__cxx11::string&,long>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                        *)txin_amount_map,&local_e0,&local_110);
            local_160._vptr_ConfidentialValue = (_func_int **)local_1b0;
            goto LAB_00206e3b;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p);
        }
        local_1a0.txid_._vptr_Txid = (_func_int **)&PTR__ConfidentialAssetId_002b0ea0;
        if ((_func_int **)
            local_1a0.txid_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (_func_int **)0x0) {
          operator_delete(local_1a0.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        local_88._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_002b0e70;
        if (local_88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      lVar15 = (long)(__x + 0x1a);
      __x = __x + 0x2c;
    } while (lVar15 != local_60);
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             *)&local_68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
               *)local_c0);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)&local_48);
  return;
}

Assistant:

void CollectUtxoDataByFundRawTransaction(
    const ConfidentialTransactionContext& ctx,
    const std::vector<ElementsUtxoAndOption>& selected_txin_utxos,
    std::map<std::string, int64_t>* txin_amount_map,
    std::map<std::string, int64_t>* tx_amount_map,
    std::vector<std::string>* asset_list, int32_t* fee_index) {
  const auto txout_list = ctx.GetTxOutList();
  for (size_t index = 0; index < txout_list.size(); ++index) {
    auto& txout = txout_list[index];
    if (txout.GetLockingScript().IsEmpty()) {
      // Excludes fees from collection
      *fee_index = static_cast<int32_t>(index);
    } else {
      std::string asset = txout.GetAsset().GetHex();
      if (std::find(asset_list->begin(), asset_list->end(), asset) ==
          asset_list->end()) {
        asset_list->push_back(asset);
      }

      if (tx_amount_map->find(asset) == tx_amount_map->end()) {
        int64_t amount = 0;
        tx_amount_map->emplace(asset, amount);
      }
      (*tx_amount_map)[asset] +=
          txout.GetConfidentialValue().GetAmount().GetSatoshiValue();
    }
  }
  std::map<std::string, std::vector<OutPoint>> asset_utxo_map;
  const auto txin_list = ctx.GetTxInList();  // txin_utxo_list
  for (const auto& elements_utxo : selected_txin_utxos) {
    for (const auto& txin : txin_list) {
      if ((txin.GetTxid().Equals(elements_utxo.utxo.txid)) &&
          (elements_utxo.utxo.vout == txin.GetVout())) {
        std::string asset = elements_utxo.utxo.asset.GetHex();
        if (std::find(asset_list->begin(), asset_list->end(), asset) ==
            asset_list->end()) {
          asset_list->push_back(asset);
        }
        if (asset_utxo_map.find(asset) == asset_utxo_map.end()) {
          std::vector<OutPoint> outpoint_list = {
              OutPoint(elements_utxo.utxo.txid, elements_utxo.utxo.vout)};
          asset_utxo_map[asset] = outpoint_list;
        } else {
          OutPoint outpoint(elements_utxo.utxo.txid, elements_utxo.utxo.vout);
          asset_utxo_map[asset].push_back(outpoint);
        }

        if (txin_amount_map->find(asset) == txin_amount_map->end()) {
          int64_t amount = 0;
          txin_amount_map->emplace(asset, amount);
        }
        (*txin_amount_map)[asset] +=
            elements_utxo.utxo.amount.GetSatoshiValue();
        break;
      }
    }
  }

  // append issuance txin data.
  for (const auto& txin : txin_list) {
    if (!txin.GetBlindingNonce().IsEmpty() ||
        !txin.GetAssetEntropy().IsEmpty()) {
      BlindFactor asset_entropy;
      std::string token;
      if (txin.GetBlindingNonce().IsEmpty()) {
        asset_entropy = ConfidentialTransaction::CalculateAssetEntropy(
            txin.GetTxid(), txin.GetVout(), txin.GetAssetEntropy());
        ConfidentialAssetId token1 =
            ConfidentialTransaction::CalculateReissuanceToken(
                asset_entropy, true);
        ConfidentialAssetId token2 =
            ConfidentialTransaction::CalculateReissuanceToken(
                asset_entropy, false);
        std::string token_blind = token1.GetHex();
        std::string token_unblind = token2.GetHex();
        if (tx_amount_map->find(token_blind) != tx_amount_map->end()) {
          token = token_blind;
        } else if (
            tx_amount_map->find(token_unblind) != tx_amount_map->end()) {
          token = token_unblind;
        }
      } else {
        asset_entropy = BlindFactor(txin.GetAssetEntropy());
      }
      ConfidentialAssetId asset_id =
          ConfidentialTransaction::CalculateAsset(asset_entropy);
      std::string asset = asset_id.GetHex();

      if (txin.GetBlindingNonce().IsEmpty()) {
        // At the time of issuance, add to map if it is not registered.
        if (txin_amount_map->find(asset) == txin_amount_map->end()) {
          txin_amount_map->emplace(
              asset, txin.GetIssuanceAmount().GetAmount().GetSatoshiValue());
        }
        if ((!token.empty()) &&
            (txin_amount_map->find(token) == txin_amount_map->end())) {
          txin_amount_map->emplace(
              token, txin.GetInflationKeys().GetAmount().GetSatoshiValue());
        }
      } else if (txin_amount_map->find(asset) == txin_amount_map->end()) {
        // At the time of reissuance, add to map if it is not registered asset.
        txin_amount_map->emplace(
            asset, txin.GetIssuanceAmount().GetAmount().GetSatoshiValue());
      } else {
        // At the time of reissuance,
        // add to map if it is not registered asset of utxo.
        OutPoint outpoint(txin.GetTxid(), txin.GetVout());
        std::vector<OutPoint>& outpoint_list = asset_utxo_map[asset];
        if (std::find(outpoint_list.begin(), outpoint_list.end(), outpoint) ==
            outpoint_list.end()) {
          (*txin_amount_map)[asset] +=
              txin.GetIssuanceAmount().GetAmount().GetSatoshiValue();
        }
      }
    }
  }
}